

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

void cio_b64_encode_buffer(uint8_t *in,size_t in_length,char *out)

{
  if (in_length == 0) {
    return;
  }
  cio_b64_encode_buffer_cold_1();
  return;
}

Assistant:

void cio_b64_encode_buffer(const uint8_t *__restrict in, size_t in_length, char *__restrict out)
{
	while (in_length) {
		unsigned int len = 0;
		unsigned int triple[3];
		for (unsigned int i = 0; i < 3; i++) {
			if (in_length) {
				triple[i] = *in++;
				len++;
				in_length--;
			} else {
				triple[i] = 0;
			}
		}

		char tmp[4];
		tmp[0] = ENCODE_TABLE[triple[0] >> 2U];
		tmp[1] = ENCODE_TABLE[((triple[0] & 0x03U) << 4U) | ((triple[1] & 0xf0U) >> 4U)]; // NOLINT
		if (cio_likely(len > 1)) {
			tmp[2] = ENCODE_TABLE[((triple[1] & 0x0fU) << 2U) | ((triple[2] & 0xc0U) >> 6U)]; // NOLINT
		} else {
			tmp[2] = '=';
		}
		if (cio_likely(len > 2)) {
			tmp[3] = ENCODE_TABLE[triple[2] & 0x3fU]; // NOLINT
		} else {
			tmp[3] = '=';
		}
		memcpy(out, tmp, sizeof(tmp));
		out += 4;
	}
}